

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordCopyApplet.cpp
# Opt level: O0

void __thiscall WordCopyApplet::WordCopyApplet(WordCopyApplet *this,Samba *samba,uint32_t addr)

{
  uint32_t addr_local;
  Samba *samba_local;
  WordCopyApplet *this_local;
  
  Applet::Applet(&this->super_Applet,samba,addr,applet.code,0x34,addr + applet.start,
                 addr + applet.stack,addr + applet.reset);
  (this->super_Applet)._vptr_Applet = (_func_int **)&PTR__WordCopyApplet_00128578;
  return;
}

Assistant:

WordCopyApplet::WordCopyApplet(Samba& samba, uint32_t addr)
    : Applet(samba,
             addr,
             applet.code,
             sizeof(applet.code),
             addr + applet.start,
             addr + applet.stack,
             addr + applet.reset)
{
}